

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void gai_scatter_acc_local
               (Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha,Integer proc)

{
  long lVar1;
  global_array_t *pgVar2;
  void **ppvVar3;
  short sVar4;
  int iVar5;
  C_Integer *pCVar6;
  int iVar7;
  Integer IVar8;
  char *pcVar9;
  void *scale;
  uint uVar10;
  int iVar11;
  Integer IVar12;
  void **__ptr;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  C_Integer CVar22;
  C_Integer CVar23;
  C_Integer CVar24;
  global_array_t *pgVar25;
  bool bVar26;
  Integer _lo [2];
  void *local_190;
  Integer ldp;
  char *ptr_ref;
  Integer _hi [2];
  void *local_160;
  armci_giov_t desc;
  Integer hi [2];
  Integer lo [2];
  
  if (nv < 1) {
    return;
  }
  lVar1 = g_a + 1000;
  iVar11 = GA[lVar1].p_handle;
  local_160 = alpha;
  pnga_distribution(g_a,proc,lo,hi);
  pgVar25 = GA;
  if (GA[lVar1].distr_type != 0) {
    IVar12 = proc;
    pnga_access_block_ptr(g_a,proc,&ptr_ref,&ldp);
    iVar5 = GA[lVar1].distr_type;
    pgVar25 = GA;
    if (iVar5 - 3U < 2) {
      sVar4 = GA[lVar1].ndim;
      uVar10 = (uint)sVar4;
      lVar17 = GA[lVar1].num_blocks[0];
      lVar14 = (long)(int)proc % lVar17;
      lVar20 = (long)(int)uVar10;
      if (1 < (int)uVar10) {
        lVar16 = 0;
        lVar15 = lVar14;
        do {
          proc = ((int)proc - lVar15) / lVar17;
          lVar17 = GA[g_a + 1000].num_blocks[lVar16 + 1];
          lVar15 = (long)(int)proc % lVar17;
          _lo[lVar16 + 1] = lVar15;
          lVar16 = lVar16 + 1;
          IVar12 = _lo[1];
        } while ((ulong)uVar10 - 1 != lVar16);
      }
      _lo[0] = lVar14 % (long)GA[lVar1].nblock[0];
      _lo[1] = IVar12 % (long)GA[lVar1].nblock[1];
      if (0 < sVar4) {
        uVar18 = 0;
        do {
          (&desc.src_ptr_array)[uVar18] =
               (void **)(_lo[uVar18] % (long)GA[g_a + 1000].nblock[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar10 != uVar18);
        proc = (Integer)(&local_160)[lVar20];
        if (1 < sVar4) {
          uVar18 = (ulong)(uVar10 - 2);
          do {
            proc = GA[g_a + 1000].nblock[uVar18] * proc + (long)(&desc.src_ptr_array)[uVar18];
            bVar26 = uVar18 != 0;
            uVar18 = uVar18 - 1;
          } while (bVar26);
        }
        goto LAB_00170ae4;
      }
    }
    else {
      if (iVar5 != 2) {
        if (iVar5 == 1) {
          IVar12 = pnga_nnodes();
          proc = proc % IVar12;
          pgVar25 = GA;
        }
        goto LAB_00170ae4;
      }
      sVar4 = GA[lVar1].ndim;
      uVar10 = (uint)sVar4;
      lVar17 = GA[lVar1].num_blocks[0];
      lVar14 = (long)(int)proc % lVar17;
      lVar20 = (long)(int)uVar10;
      if (1 < (int)uVar10) {
        lVar16 = 0;
        lVar15 = lVar14;
        do {
          proc = ((int)proc - lVar15) / lVar17;
          lVar17 = GA[g_a + 1000].num_blocks[lVar16 + 1];
          lVar15 = (long)(int)proc % lVar17;
          _lo[lVar16 + 1] = lVar15;
          lVar16 = lVar16 + 1;
          IVar12 = _lo[1];
        } while ((ulong)uVar10 - 1 != lVar16);
      }
      _lo[0] = lVar14 % (long)GA[lVar1].nblock[0];
      _lo[1] = IVar12 % (long)GA[lVar1].nblock[1];
      if (0 < sVar4) {
        uVar18 = 0;
        do {
          (&desc.src_ptr_array)[uVar18] =
               (void **)(_lo[uVar18] % (long)GA[g_a + 1000].nblock[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar10 != uVar18);
        proc = (Integer)(&local_160)[lVar20];
        if (1 < sVar4) {
          uVar18 = (ulong)(uVar10 - 2);
          do {
            proc = GA[g_a + 1000].nblock[uVar18] * proc + (long)(&desc.src_ptr_array)[uVar18];
            bVar26 = uVar18 != 0;
            uVar18 = uVar18 - 1;
          } while (bVar26);
        }
        goto LAB_00170ae4;
      }
    }
    proc = (Integer)(&local_160)[lVar20];
    goto LAB_00170ae4;
  }
  pgVar2 = GA + lVar1;
  lVar17 = pgVar2->num_rstrctd;
  if (lVar17 < 1) {
    CVar23 = pgVar2->width[0];
    CVar22 = pgVar2->width[1];
    lVar14 = proc;
    if (lVar17 != 0) goto LAB_00170651;
    sVar4 = pgVar2->ndim;
    lVar20 = (long)sVar4;
    if (lVar20 < 1) goto LAB_001709ad;
    lVar15 = 1;
    lVar16 = 0;
    do {
      lVar15 = lVar15 * GA[g_a + 1000].nblock[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar20 != lVar16);
    if ((-1 < proc) && (lVar15 - proc != 0 && proc <= lVar15)) {
      if (0 < sVar4) {
        pCVar6 = pgVar2->mapc;
        lVar15 = 0;
        lVar16 = 0;
        IVar12 = proc;
        do {
          lVar13 = (long)GA[g_a + 1000].nblock[lVar15];
          lVar19 = IVar12 % lVar13;
          _lo[lVar15] = pCVar6[lVar19 + lVar16];
          if (lVar19 == lVar13 + -1) {
            CVar24 = GA[g_a + 1000].dims[lVar15];
          }
          else {
            CVar24 = pCVar6[lVar19 + lVar16 + 1] + -1;
          }
          lVar16 = lVar16 + lVar13;
          _hi[lVar15] = CVar24;
          lVar15 = lVar15 + 1;
          IVar12 = IVar12 / lVar13;
        } while (lVar20 != lVar15);
      }
      goto LAB_001709ad;
    }
joined_r0x00170740:
    if (0 < sVar4) {
      memset(_lo,0,lVar20 << 3);
      memset(_hi,0xff,lVar20 << 3);
    }
  }
  else {
    CVar23 = pgVar2->width[0];
    CVar22 = pgVar2->width[1];
    lVar14 = pgVar2->rank_rstrctd[proc];
LAB_00170651:
    sVar4 = pgVar2->ndim;
    lVar20 = (long)sVar4;
    if (lVar17 <= lVar14) goto joined_r0x00170740;
    if (0 < sVar4) {
      lVar15 = 1;
      lVar16 = 0;
      do {
        lVar15 = lVar15 * GA[g_a + 1000].nblock[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar20 != lVar16);
      if ((lVar14 < 0) || (lVar15 <= lVar14)) goto joined_r0x00170740;
      if (0 < sVar4) {
        pCVar6 = pgVar2->mapc;
        lVar16 = 0;
        lVar19 = 0;
        lVar15 = lVar14;
        do {
          lVar21 = (long)GA[g_a + 1000].nblock[lVar19];
          lVar13 = lVar15 % lVar21;
          _lo[lVar19] = pCVar6[lVar13 + lVar16];
          if (lVar13 == lVar21 + -1) {
            CVar24 = GA[g_a + 1000].dims[lVar19];
          }
          else {
            CVar24 = pCVar6[lVar13 + lVar16 + 1] + -1;
          }
          lVar16 = lVar16 + lVar21;
          _hi[lVar19] = CVar24;
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 / lVar21;
        } while (lVar20 != lVar19);
      }
    }
  }
LAB_001709ad:
  IVar8 = _lo[1];
  IVar12 = _lo[0];
  if (pgVar2->p_handle == 0) {
    CVar24 = (C_Integer)PGRP_LIST->inv_map_proc_list[lVar14];
  }
  else {
    CVar24 = lVar14;
    if (lVar17 != 0) {
      CVar24 = pgVar2->rstrctd_list[lVar14];
    }
  }
  if ((_hi[1] < lo[1] || _hi[0] < lo[0]) || (lo[1] < _lo[1] || lo[0] < _lo[0])) {
    sprintf((char *)&desc,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
            lVar14,lo[0],lo[1],_lo[0],_hi[0],_lo[1],_hi[1]);
    pnga_error((char *)&desc,g_a);
    pgVar25 = GA;
  }
  ldp = ((CVar23 * 2 + 1) - IVar12) + _hi[0];
  ptr_ref = pgVar25[lVar1].ptr[CVar24] +
            (((CVar23 + lo[0]) - IVar12) + ((CVar22 + lo[1]) - IVar8) * ldp) *
            *(long *)(BYTE_ARRAY_001d157d + (long)pgVar25[lVar1].type * 0x10 + 0xb);
LAB_00170ae4:
  iVar5 = pgVar25[lVar1].type;
  lVar1 = *(long *)(BYTE_ARRAY_001d157d + (long)iVar5 * 0x10 + 0xb);
  iVar7 = (int)nv;
  __ptr = (void **)malloc((long)(iVar7 * 2) << 3);
  if (__ptr == (void **)0x0) {
    pnga_error("malloc failed",nv);
  }
  pcVar9 = ptr_ref;
  IVar12 = ldp;
  ppvVar3 = __ptr + nv;
  lVar17 = 0;
  local_190 = v;
  do {
    lVar14 = i[lVar17];
    lVar20 = j[lVar17];
    if ((hi[0] < lVar14 || lVar14 < lo[0]) || (hi[1] < lVar20 || lVar20 < lo[1])) {
      sprintf((char *)&desc,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",proc);
      pnga_error((char *)&desc,g_a);
      lVar20 = j[lVar17];
      lVar14 = i[lVar17];
    }
    scale = local_160;
    ppvVar3[lVar17] = pcVar9 + ((lVar14 - lo[0]) + (lVar20 - lo[1]) * IVar12) * lVar1;
    __ptr[lVar17] = local_190;
    lVar17 = lVar17 + 1;
    local_190 = (void *)((long)local_190 + lVar1);
  } while (nv != lVar17);
  desc.bytes = (int)lVar1;
  if (GA_fence_set != 0) {
    fence_array[proc] = '\x01';
  }
  if (-1 < iVar11) {
    proc = (Integer)(uint)PGRP_LIST[iVar11].inv_map_proc_list[proc];
  }
  desc.src_ptr_array = __ptr;
  desc.dst_ptr_array = ppvVar3;
  desc.ptr_array_len = iVar7;
  if (local_160 != (void *)0x0) {
    uVar10 = iVar5 - 0x3e9;
    if ((uVar10 < 7) && ((0x6fU >> (uVar10 & 0x1f) & 1) != 0)) {
      iVar11 = *(int *)(&DAT_001b9070 + (ulong)uVar10 * 4);
    }
    else {
      pnga_error("type not supported",(long)iVar5);
      iVar11 = -1;
    }
    iVar11 = ARMCI_AccV(iVar11,scale,&desc,1,(int)proc);
    if (iVar11 != 0) {
      pnga_error("scatter/_acc failed in armci",(long)iVar11);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void gai_scatter_acc_local(Integer g_a, void *v,Integer *i,Integer *j,
                          Integer nv, void* alpha, Integer proc) 
{
void **ptr_src, **ptr_dst;
char *ptr_ref;
Integer ldp, item_size, ilo, ihi, jlo, jhi, type;
Integer lo[2], hi[2];
Integer handle,p_handle,iproc;
armci_giov_t desc;
register Integer k, offset;
int rc=0;

  if (nv < 1) return;

  
  handle = GA_OFFSET + g_a;
  p_handle = GA[handle].p_handle;

  pnga_distribution(g_a, proc, lo, hi);
  ilo = lo[0];
  jlo = lo[1];
  ihi = hi[0];
  jhi = hi[1];

  iproc = proc;
  if (GA[handle].distr_type == REGULAR) {
    if (GA[handle].num_rstrctd > 0)
      iproc = GA[handle].rank_rstrctd[iproc];
    gaShmemLocation(iproc, g_a, ilo, jlo, &ptr_ref, &ldp);
  } else {
    /*
    Integer lo[2];
    lo[0] = ilo;
    lo[1] = jlo;
    */
    pnga_access_block_ptr(g_a, iproc, &ptr_ref, &ldp);
    pnga_release_block(g_a, iproc);
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_tile_proc_from_indices(handle,proc,index);
    }

  }

  type = GA[handle].type;
  item_size = GAsizeofM(type);

  ptr_src = malloc((int)nv*2*sizeof(void*));
  if(ptr_src==NULL)pnga_error("malloc failed",nv);
  ptr_dst=ptr_src+ nv;

  for(k=0; k< nv; k++){
     if(i[k] < ilo || i[k] > ihi  || j[k] < jlo || j[k] > jhi){
       char err_string[ERR_STR_LEN];
       sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",
               (int)proc, (long)i[k], (long)j[k], (long)ilo, 
               (long)ihi, (long)jlo, (long)jhi); 
       pnga_error(err_string,g_a);
     }

     offset  = (j[k] - jlo)* ldp + i[k] - ilo;
     ptr_dst[k] = ptr_ref + item_size * offset;
     ptr_src[k] = ((char*)v) + k*item_size;
  }
  desc.bytes = (int)item_size;
  desc.src_ptr_array = ptr_src;
  desc.dst_ptr_array = ptr_dst;
  desc.ptr_array_len = (int)nv;

  if(GA_fence_set)fence_array[proc]=1;

  if (p_handle >= 0) {
    proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
  }
  if(alpha != NULL) {
    int optype=-1;
    if(type==C_DBL) optype= ARMCI_ACC_DBL;
    else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
    else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
    else if(type==C_INT)optype= ARMCI_ACC_INT;
    else if(type==C_LONG)optype= ARMCI_ACC_LNG;
    else if(type==C_FLOAT)optype= ARMCI_ACC_FLT;  
    else pnga_error("type not supported",type);
    rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)proc);
  }

  if(rc) pnga_error("scatter/_acc failed in armci",rc);

  free(ptr_src);

}